

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDispatch<void>::
call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_timeout::fulfilledStdChrono()::__1>
          (PromiseDispatch<void> *this,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
          anon_class_16_2_30a9d772 fn)

{
  Data *pDVar1;
  
  pDVar1 = (Data *)QElapsedTimer::elapsed();
  (reject->m_resolver).m_d.d = pDVar1;
  PromiseResolver<void>::resolve((PromiseResolver<void> *)this);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }